

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.h
# Opt level: O2

EmissionSystem * __thiscall
KDIS::DATA_TYPE::EmissionSystem::operator=(EmissionSystem *this,EmissionSystem *param_1)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  KUINT8 KVar3;
  KFLOAT32 KVar4;
  
  KVar1 = param_1->m_ui8NumberOfBeams;
  KVar2 = param_1->m_ui16Padding;
  this->m_ui8SystemDataLength = param_1->m_ui8SystemDataLength;
  this->m_ui8NumberOfBeams = KVar1;
  this->m_ui16Padding = KVar2;
  KVar1 = (param_1->m_EmitterSystemRecord).m_ui8Function;
  KVar3 = (param_1->m_EmitterSystemRecord).m_ui8EmitterIDNumber;
  (this->m_EmitterSystemRecord).m_ui16EmitterName =
       (param_1->m_EmitterSystemRecord).m_ui16EmitterName;
  (this->m_EmitterSystemRecord).m_ui8Function = KVar1;
  (this->m_EmitterSystemRecord).m_ui8EmitterIDNumber = KVar3;
  KVar4 = (param_1->m_Location).m_f32Y;
  (this->m_Location).m_f32X = (param_1->m_Location).m_f32X;
  (this->m_Location).m_f32Y = KVar4;
  (this->m_Location).m_f32Z = (param_1->m_Location).m_f32Z;
  std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>::
  operator=(&this->m_vEmitterBeams,&param_1->m_vEmitterBeams);
  return this;
}

Assistant:

class KDIS_EXPORT EmissionSystem : public DataTypeBase
{
protected:

    KUINT8 m_ui8SystemDataLength;

    KUINT8 m_ui8NumberOfBeams;

    KUINT16 m_ui16Padding;

    EmitterSystem m_EmitterSystemRecord;

    Vector m_Location;

    std::vector<EmitterBeam> m_vEmitterBeams;

public:

    static const KUINT16 EMISSION_SYSTEM_SIZE = 20; // Min Size

    EmissionSystem();

    EmissionSystem(KDataStream &stream) noexcept(false);

    EmissionSystem( const EmitterSystem & ESR, const Vector & Location );

    virtual ~EmissionSystem();

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmissionSystem::GetSystemDataLength
    // Description: Length of the emission system in 32 bit words.
    //              E.G 1 = 32 bits / 4 octets. Calculated automatically.
    //************************************
    KUINT8 GetSystemDataLength() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmissionSystem::SetEmitterSystemRecord
    //              KDIS::DATA_TYPE::EmissionSystem::GetEmitterSystemRecord
    // Description: Contains information about a particular emitter system
    // Parameter:   const EmitterSystem & ESR
    //************************************
    void SetEmitterSystemRecord( const EmitterSystem & ESR );
    EmitterSystem GetEmitterSystemRecord() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmissionSystem::SetLocation
    //              KDIS::DATA_TYPE::EmissionSystem::GetLocation
    // Description: Location of antenna beam source with respect to emitting
    //              entity coordinate system. Represented as Entity Coordinate Vector.
    // Parameter:   const Vector & L
    //************************************
    void SetLocation( const Vector & L );
    const Vector & GetLocation() const;
    Vector & GetLocation();

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmissionSystem::AddEmitterBeam
    //              KDIS::DATA_TYPE::EmissionSystem::SetEmitterBeams
    //              KDIS::DATA_TYPE::EmissionSystem::GetEmitterBeams
    // Description: The emitter beans attached to this system.
    // Parameter:   const EmitterBeam & EB, const vector<EmitterBeam> & Beams
    //************************************
    void AddEmitterBeam( const EmitterBeam & EB );
    void SetEmitterBeams( const std::vector<EmitterBeam> & Beams );
    const std::vector<EmitterBeam> & GetEmitterBeams() const;
    void ClearEmitterBeams();

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmissionSystem::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmissionSystem::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmissionSystem::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const EmissionSystem & Value ) const;
    KBOOL operator != ( const EmissionSystem & Value ) const;
}